

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,char_writer *f)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char __tmp;
  char local_5a;
  char local_59;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char_writer *local_40;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_38;
  
  uVar6 = (ulong)spec->width_;
  if (1 < uVar6) {
    local_5a = (char)spec->fill_;
    uVar5 = uVar6 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar2 = uVar5 >> 1;
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      local_59 = local_5a;
      local_40 = f;
      local_38 = (ostream_iterator<char,_char,_std::char_traits<char>_> *)this;
      if (spec->width_ != 2) {
        uVar4 = uVar2;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      poVar1 = local_38;
      local_38->_M_stream = local_58._M_stream;
      local_38->_M_string = local_58._M_string;
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                (local_38,&local_40->value);
      local_58._M_stream = poVar1->_M_stream;
      local_58._M_string = poVar1->_M_string;
      local_5a = local_59;
      if (uVar5 != uVar2) {
        lVar3 = (uVar2 - uVar6) + 1;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
      }
      poVar1->_M_stream = local_58._M_stream;
      poVar1->_M_string = local_58._M_string;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      if (uVar5 != 0) {
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      *(ostream_type **)this = local_58._M_stream;
      *(char **)(this + 8) = local_58._M_string;
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
    }
    else {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      if (uVar5 != 0) {
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      *(ostream_type **)this = local_58._M_stream;
      *(char **)(this + 8) = local_58._M_string;
    }
    return;
  }
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&f->value);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }